

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

double __thiscall
despot::Parser::ObsProb
          (Parser *this,OBS_TYPE obs,vector<int,_std::allocator<int>_> *state,ACT_TYPE action)

{
  value_type vVar1;
  value_type pCVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference ppCVar8;
  double extraout_XMM0_Qa;
  int local_34;
  double dStack_30;
  int o;
  double prob;
  int s;
  ACT_TYPE action_local;
  vector<int,_std::allocator<int>_> *state_local;
  OBS_TYPE obs_local;
  Parser *this_local;
  
  prob._0_4_ = 0;
  while( true ) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(state);
    if (sVar4 <= (ulong)(long)prob._0_4_) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](state,(long)prob._0_4_);
    vVar1 = *pvVar5;
    pvVar6 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->curr_state_vars_,(long)prob._0_4_);
    (pvVar6->super_NamedVar).super_Variable.curr_value = vVar1;
    prob._0_4_ = prob._0_4_ + 1;
  }
  pvVar7 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                     (&this->action_vars_,0);
  (pvVar7->super_Variable).curr_value = action;
  dStack_30 = 1.0;
  sVar4 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size(&this->obs_vars_);
  local_34 = (int)sVar4;
  state_local = (vector<int,_std::allocator<int>_> *)obs;
  while (local_34 = local_34 + -1, -1 < local_34) {
    ppCVar8 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::operator[]
                        (&this->obs_funcs_,(long)local_34);
    pCVar2 = *ppCVar8;
    pvVar7 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)local_34);
    iVar3 = Variable::Size(&pvVar7->super_Variable);
    (*(pCVar2->super_Function)._vptr_Function[5])
              (pCVar2,(ulong)state_local % (ulong)(long)iVar3 & 0xffffffff);
    dStack_30 = extraout_XMM0_Qa * dStack_30;
    pvVar7 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)local_34);
    iVar3 = Variable::Size(&pvVar7->super_Variable);
    state_local = (vector<int,_std::allocator<int>_> *)((ulong)state_local / (ulong)(long)iVar3);
  }
  return dStack_30;
}

Assistant:

double Parser::ObsProb(OBS_TYPE obs, const vector<int>& state,
	ACT_TYPE action) const {
	for (int s = 0; s < state.size(); s++) {
		curr_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	double prob = 1.0;
	for (int o = obs_vars_.size() - 1; o >= 0; o--) {
		prob *= obs_funcs_[o]->GetValue(obs % obs_vars_[o].Size());
		obs /= obs_vars_[o].Size();
	}
	return prob;
}